

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingcategory.h
# Opt level: O0

int __thiscall
anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)4>::init
          (QLoggingCategoryMacroHolder<(QtMsgType)4> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  
  this->category = (QLoggingCategory *)ctx;
  bVar1 = QLoggingCategory::isInfoEnabled((QLoggingCategory *)0xb25fb9);
  this->control = bVar1;
  return (int)this;
}

Assistant:

void init(const QLoggingCategory &cat) noexcept
    {
        category = &cat;
        // same as:
        //  control = cat.isEnabled(Which);
        // but without an out-of-line call
        if constexpr (Which == QtDebugMsg) {
            control = cat.isDebugEnabled();
        } else if constexpr (Which == QtInfoMsg) {
            control = cat.isInfoEnabled();
        } else if constexpr (Which == QtWarningMsg) {
            control = cat.isWarningEnabled();
        } else if constexpr (Which == QtCriticalMsg) {
            control = cat.isCriticalEnabled();
        } else if constexpr (Which == QtFatalMsg) {
            control = true;
        } else {
            static_assert(QtPrivate::value_dependent_false<Which>(), "Unknown Qt message type");
        }
    }